

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::LogMessageBody::LogMessageBody(LogMessageBody *this,LogMessageBody *param_1)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__LogMessageBody_004083d8;
  this->iid_ = param_1->iid_;
  ::std::__cxx11::string::string((string *)&this->body_,(string *)&param_1->body_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

LogMessageBody::LogMessageBody(LogMessageBody&&) noexcept = default;